

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

UBool isSpecialTypeReorderCode(char *val)

{
  UBool UVar1;
  bool local_29;
  char *local_28;
  char *p;
  int32_t subtagLen;
  char *val_local;
  
  p._4_4_ = 0;
  local_28 = val;
  do {
    if (*local_28 == '\0') {
      local_29 = 2 < p._4_4_ && p._4_4_ < 9;
      return local_29;
    }
    if (*local_28 == '-') {
      if ((p._4_4_ < 3) || (8 < p._4_4_)) {
        return '\0';
      }
      p._4_4_ = 0;
    }
    else {
      UVar1 = uprv_isASCIILetter_63(*local_28);
      if (UVar1 == '\0') {
        return '\0';
      }
      p._4_4_ = p._4_4_ + 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static UBool
isSpecialTypeReorderCode(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if (*p == '-') {
            if (subtagLen < 3 || subtagLen > 8) {
                return FALSE;
            }
            subtagLen = 0;
        } else if (uprv_isASCIILetter(*p)) {
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen >=3 && subtagLen <=8);
}